

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFMatrix.cc
# Opt level: O3

Matrix * __thiscall QPDFMatrix::getAsMatrix(QPDFMatrix *this)

{
  double dVar1;
  Matrix *in_RDI;
  
  dVar1 = this->b;
  in_RDI->a = this->a;
  in_RDI->b = dVar1;
  dVar1 = this->d;
  in_RDI->c = this->c;
  in_RDI->d = dVar1;
  dVar1 = this->f;
  in_RDI->e = this->e;
  in_RDI->f = dVar1;
  return in_RDI;
}

Assistant:

QPDFObjectHandle::Matrix
QPDFMatrix::getAsMatrix() const
{
    return {a, b, c, d, e, f};
}